

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

result<long,_toml::error_info> * toml::read_int<long>(string *str,source_location *src,uint8_t base)

{
  char in_CL;
  string *in_RDX;
  source_location *in_RSI;
  result<long,_toml::error_info> *in_RDI;
  source_location *in_stack_00000110;
  string *in_stack_00000118;
  source_location *in_stack_fffffffffffffd90;
  source_location *in_stack_fffffffffffffda8;
  source_location *in_stack_fffffffffffffdb0;
  source_location local_198 [3];
  undefined7 in_stack_ffffffffffffffe0;
  
  if (in_CL == '\x02') {
    source_location::source_location(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    read_bin_int<long>(in_RDX,(source_location *)CONCAT17(in_CL,in_stack_ffffffffffffffe0));
    source_location::~source_location(in_stack_fffffffffffffd90);
  }
  else if (in_CL == '\b') {
    source_location::source_location(in_RSI,in_stack_fffffffffffffda8);
    read_oct_int<long>(in_stack_00000118,in_stack_00000110);
    source_location::~source_location(in_stack_fffffffffffffd90);
  }
  else if (in_CL == '\x10') {
    source_location::source_location(in_stack_fffffffffffffdb0,local_198);
    read_hex_int<long>(in_stack_00000118,in_stack_00000110);
    source_location::~source_location(in_stack_fffffffffffffd90);
  }
  else {
    source_location::source_location(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    read_dec_int<long>(in_stack_00000118,in_stack_00000110);
    source_location::~source_location(in_RSI);
  }
  return in_RDI;
}

Assistant:

result<T, error_info>
read_int(const std::string& str, const source_location src, const std::uint8_t base)
{
    assert(base == 10 || base == 16 || base == 8 || base == 2);
    switch(base)
    {
        case  2: { return read_bin_int<T>(str, src); }
        case  8: { return read_oct_int<T>(str, src); }
        case 16: { return read_hex_int<T>(str, src); }
        default:
        {
            assert(base == 10);
            return read_dec_int<T>(str, src);
        }
    }
}